

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

void __thiscall
gvr::PLYWriter::addProperty(PLYWriter *this,string *name,ply_type tsize,ply_type tvalue)

{
  long lVar1;
  undefined8 uVar2;
  PLYProperty *in_RDI;
  PLYProperty *in_stack_ffffffffffffff08;
  PLYProperty *this_00;
  undefined8 in_stack_ffffffffffffff28;
  allocator *paVar3;
  undefined8 in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff48;
  IOException *in_stack_ffffffffffffff50;
  allocator local_71;
  string local_70 [35];
  undefined1 local_4d;
  allocator local_39;
  string local_38 [56];
  
  if ((in_RDI->field_0x20 & 1) != 0) {
    local_4d = 1;
    uVar2 = __cxa_allocate_exception(0x28);
    paVar3 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Creation of ply header has been completed",paVar3);
    gutil::IOException::IOException(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    local_4d = 0;
    __cxa_throw(uVar2,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  lVar1._0_4_ = in_RDI->tsize;
  lVar1._4_4_ = in_RDI->tvalue;
  if (lVar1 == 0) {
    uVar2 = __cxa_allocate_exception(0x28);
    paVar3 = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"PLYWriter: Adding a property without an element",paVar3);
    gutil::IOException::IOException(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    __cxa_throw(uVar2,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  this_00 = *(PLYProperty **)&in_RDI->tsize;
  anon_unknown_3::PLYProperty::PLYProperty
            (in_RDI,in_stack_ffffffffffffff38,(ply_type)((ulong)in_stack_ffffffffffffff30 >> 0x20),
             (ply_type)in_stack_ffffffffffffff30,
             (ply_encoding)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  PLYElement::addProperty((PLYElement *)this_00,in_stack_ffffffffffffff08);
  anon_unknown_3::PLYProperty::~PLYProperty(this_00);
  return;
}

Assistant:

void PLYWriter::addProperty(const std::string &name, ply_type tsize, ply_type tvalue)
{
  if (header_complete)
  {
    throw gutil::IOException("Creation of ply header has been completed");
  }

  if (element == 0)
  {
    throw gutil::IOException("PLYWriter: Adding a property without an element");
  }

  element->addProperty(PLYProperty(name, tsize, tvalue, enc));
}